

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2a5940::SignatureExtractorChecker::CheckECDSASignature
          (SignatureExtractorChecker *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *scriptSig,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchPubKey,CScript *scriptCode,
          SigVersion sigversion)

{
  Span<const_unsigned_char> _vch;
  ulong uVar1;
  CKeyID *__args;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  bool bVar2;
  CPubKey pubkey;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  Span<const_unsigned_char> *in_stack_fffffffffffffea8;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this_00;
  uchar *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *this_01;
  CPubKey *in_stack_fffffffffffffec0;
  undefined1 local_5d [85];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (**(code **)**(undefined8 **)(in_RDI + 8))
                    (*(undefined8 **)(in_RDI + 8),in_RSI,in_RDX,in_RCX,in_R8D);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffea8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    this_00 = (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              (local_5d + 0x14);
    _vch.m_size = in_stack_fffffffffffffeb8;
    _vch.m_data = in_stack_fffffffffffffeb0;
    CPubKey::CPubKey((CPubKey *)this_00,_vch);
    __args = (CKeyID *)(*(long *)(in_RDI + 0x10) + 0x160);
    this_01 = (map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               *)local_5d;
    CPubKey::GetID(in_stack_fffffffffffffec0);
    std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    pair<CPubKey_&,_true>
              (this_00,(CPubKey *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
    std::
    map<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
    ::emplace<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (this_01,__args,this_00);
    std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~pair
              (in_stack_fffffffffffffe98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CheckECDSASignature(const std::vector<unsigned char>& scriptSig, const std::vector<unsigned char>& vchPubKey, const CScript& scriptCode, SigVersion sigversion) const override
    {
        if (m_checker.CheckECDSASignature(scriptSig, vchPubKey, scriptCode, sigversion)) {
            CPubKey pubkey(vchPubKey);
            sigdata.signatures.emplace(pubkey.GetID(), SigPair(pubkey, scriptSig));
            return true;
        }
        return false;
    }